

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_simd_shift_intfp_conv
               (DisasContext_conflict1 *s,_Bool is_scalar,_Bool is_q,_Bool is_u,int immh,int immb,
               int opcode,int rn,int rd)

{
  _Bool _Var1;
  int immhb;
  int fracbits;
  int elements;
  int size;
  int immb_local;
  int immh_local;
  _Bool is_u_local;
  _Bool is_q_local;
  _Bool is_scalar_local;
  DisasContext_conflict1 *s_local;
  
  if ((immh & 8U) == 0) {
    if ((immh & 4U) == 0) {
      if ((immh & 2U) == 0) {
        if (immh == 1) {
          unallocated_encoding_aarch64(s);
          return;
        }
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x222d,"immh == 1");
      }
      fracbits = 1;
      _Var1 = isar_feature_aa64_fp16(s->isar);
      if (!_Var1) {
        unallocated_encoding_aarch64(s);
        return;
      }
    }
    else {
      fracbits = 2;
    }
  }
  else {
    fracbits = 3;
    if ((!is_scalar) && (!is_q)) {
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  if (is_scalar) {
    immhb = 1;
  }
  else {
    immhb = (8 << is_q) >> (sbyte)fracbits;
  }
  _Var1 = fp_access_check(s);
  if (_Var1) {
    handle_simd_intfp_conv
              (s,rd,rn,immhb,(uint)((is_u ^ 0xffU) & 1),
               (0x10 << (sbyte)fracbits) - (immh << 3 | immb),fracbits);
  }
  return;
}

Assistant:

static void handle_simd_shift_intfp_conv(DisasContext *s, bool is_scalar,
                                         bool is_q, bool is_u,
                                         int immh, int immb, int opcode,
                                         int rn, int rd)
{
    int size, elements, fracbits;
    int immhb = immh << 3 | immb;

    if (immh & 8) {
        size = MO_64;
        if (!is_scalar && !is_q) {
            unallocated_encoding(s);
            return;
        }
    } else if (immh & 4) {
        size = MO_32;
    } else if (immh & 2) {
        size = MO_16;
        if (!dc_isar_feature(aa64_fp16, s)) {
            unallocated_encoding(s);
            return;
        }
    } else {
        /* immh == 0 would be a failure of the decode logic */
        g_assert(immh == 1);
        unallocated_encoding(s);
        return;
    }

    if (is_scalar) {
        elements = 1;
    } else {
        elements = (8 << is_q) >> size;
    }
    fracbits = (16 << size) - immhb;

    if (!fp_access_check(s)) {
        return;
    }

    handle_simd_intfp_conv(s, rd, rn, elements, !is_u, fracbits, size);
}